

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

int __thiscall cmGraphVizWriter::CollectAllExternalLibs(cmGraphVizWriter *this,int cnt)

{
  char *pcVar1;
  bool bVar2;
  string *psVar3;
  iterator iVar4;
  ostream *this_00;
  mapped_type *this_01;
  mapped_type *ppcVar5;
  pointer ppcVar6;
  pointer ppVar7;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  ostringstream ostr;
  int local_238;
  allocator local_231;
  key_type local_230;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
  *local_210;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_208;
  pointer local_1f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1e8;
  pointer local_1e0;
  _Base_ptr local_1d8;
  cmTarget *local_1d0;
  key_type local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1f0 = (this->LocalGenerators->
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_238 = cnt;
  if (local_1f0 !=
      (this->LocalGenerators->
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_210 = &this->TargetPtrs;
    local_1d8 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e8 = &this->TargetNamesNodes;
    do {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_208,&(*local_1f0)->GeneratorTargets);
      ppcVar6 = local_208.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (ppcVar6 !=
             local_208.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar6);
        std::__cxx11::string::string
                  ((string *)local_1a8,(psVar3->_M_dataplus)._M_p,(allocator *)&local_230);
        bVar2 = IgnoreThisTarget(this,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        local_1e0 = ppcVar6;
        if (!bVar2) {
          local_1d0 = (*ppcVar6)->Target;
          for (ppVar7 = (local_1d0->OriginalLinkLibraries).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar7 != (local_1d0->OriginalLinkLibraries).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; ppVar7 = ppVar7 + 1) {
            pcVar1 = (ppVar7->first)._M_dataplus._M_p;
            std::__cxx11::string::string((string *)local_1a8,pcVar1,(allocator *)&local_230);
            bVar2 = IgnoreThisTarget(this,local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p,
                              local_1a8[0].field_2._M_allocated_capacity + 1);
            }
            if (!bVar2) {
              std::__cxx11::string::string((string *)local_1a8,pcVar1,(allocator *)&local_230);
              iVar4 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                      ::find(&local_210->_M_t,local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                operator_delete(local_1a8[0]._M_dataplus._M_p,
                                local_1a8[0].field_2._M_allocated_capacity + 1);
              }
              if (iVar4._M_node == local_1d8) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                this_00 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,(this->GraphNodePrefix)._M_dataplus._M_p,
                                     (this->GraphNodePrefix)._M_string_length);
                std::ostream::operator<<(this_00,local_238);
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::string((string *)&local_1c8,pcVar1,&local_231);
                this_01 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](local_1e8,&local_1c8);
                std::__cxx11::string::operator=((string *)this_01,(string *)&local_230);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                  operator_delete(local_1c8._M_dataplus._M_p,
                                  local_1c8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_230._M_dataplus._M_p != &local_230.field_2) {
                  operator_delete(local_230._M_dataplus._M_p,
                                  local_230.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::string((string *)&local_230,pcVar1,(allocator *)&local_1c8);
                ppcVar5 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                          ::operator[](local_210,&local_230);
                *ppcVar5 = (mapped_type)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_230._M_dataplus._M_p != &local_230.field_2) {
                  operator_delete(local_230._M_dataplus._M_p,
                                  local_230.field_2._M_allocated_capacity + 1);
                }
                local_238 = local_238 + 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
              }
            }
          }
        }
        ppcVar6 = local_1e0 + 1;
      }
      if (local_208.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_208.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_208.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_1f0 = local_1f0 + 1;
    } while (local_1f0 !=
             (this->LocalGenerators->
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return local_238;
}

Assistant:

int cmGraphVizWriter::CollectAllExternalLibs(int cnt)
{
  // Ok, now find all the stuff we link to that is not in cmake
  for (std::vector<cmLocalGenerator*>::const_iterator lit =
                                                 this->LocalGenerators.begin();
       lit != this->LocalGenerators.end();
       ++ lit )
    {
    std::vector<cmGeneratorTarget*> targets = (*lit)->GetGeneratorTargets();
    for ( std::vector<cmGeneratorTarget*>::const_iterator it =
          targets.begin(); it != targets.end(); ++it )
      {
      const char* realTargetName = (*it)->GetName().c_str();
      if (this->IgnoreThisTarget(realTargetName))
        {
        // Skip ignored targets
        continue;
        }
      const cmTarget::LinkLibraryVectorType* ll =
          &((*it)->Target->GetOriginalLinkLibraries());
      for (cmTarget::LinkLibraryVectorType::const_iterator llit = ll->begin();
           llit != ll->end();
           ++ llit )
        {
        const char* libName = llit->first.c_str();
        if (this->IgnoreThisTarget(libName))
          {
          // Skip ignored targets
          continue;
          }

        std::map<std::string, const cmGeneratorTarget*>::const_iterator tarIt
            = this->TargetPtrs.find(libName);
        if ( tarIt == this->TargetPtrs.end() )
          {
          std::ostringstream ostr;
          ostr << this->GraphNodePrefix << cnt++;
          this->TargetNamesNodes[libName] = ostr.str();
          this->TargetPtrs[libName] = NULL;
          // str << "    \"" << ostr.c_str() << "\" [ label=\"" << libName
          // <<  "\" shape=\"ellipse\"];" << std::endl;
          }
        }
      }
    }
   return cnt;
}